

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool *pbVar1;
  uint seed_00;
  pair<int,_int> pVar2;
  ulong uVar3;
  const_iterator pbVar4;
  long in_RSI;
  int in_EDI;
  pair<int,_int> result_2;
  pair<int,_int> result_1;
  bool only_meta;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bool> *__range2;
  ggml_backend_dev_t dev;
  size_t i;
  pair<int,_int> result;
  int ntest;
  int npass;
  uint seed;
  random_device rd;
  size_t *in_stack_ffffffffffffeb68;
  pair<int,_int> in_stack_ffffffffffffeb70;
  undefined4 in_stack_ffffffffffffeba0;
  undefined4 in_stack_ffffffffffffeba4;
  char *__s;
  random_device *in_stack_ffffffffffffebb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  int local_143c;
  int iStack_1438;
  int local_1434;
  int iStack_1430;
  const_iterator local_1420;
  bool local_1412 [6];
  ggml_backend_dev_t dev_00;
  ulong local_13f0;
  uint local_13e4;
  uint uStack_13e0;
  uint local_13dc;
  uint local_13d8;
  undefined1 local_13d1 [36];
  undefined1 in_stack_ffffffffffffec53;
  uint in_stack_ffffffffffffec54;
  ggml_backend_dev_t in_stack_ffffffffffffec58;
  uint in_stack_ffffffffffffecec;
  uint local_4;
  
  if (in_EDI < 3) {
    std::random_device::random_device(in_stack_ffffffffffffebb0);
    if (in_EDI < 2) {
      std::random_device::operator()((random_device *)0x10a966);
    }
    else {
      __s = *(char **)(in_RSI + 8);
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_13d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,__s,(allocator<char> *)
                          CONCAT44(in_stack_ffffffffffffeba4,in_stack_ffffffffffffeba0));
      std::__cxx11::stoi((string *)in_stack_ffffffffffffeb70,in_stack_ffffffffffffeb68,0);
      std::__cxx11::string::~string((string *)(local_13d1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_13d1);
    }
    ggml_backend_dev_count();
    fprintf(_stderr,"\n");
    pVar2 = test_handcrafted_file(in_stack_ffffffffffffecec);
    local_13e4 = pVar2.first;
    local_13d8 = local_13e4;
    uStack_13e0 = pVar2.second;
    local_13dc = uStack_13e0;
    for (local_13f0 = 0; uVar3 = ggml_backend_dev_count(), local_13f0 < uVar3;
        local_13f0 = local_13f0 + 1) {
      ggml_backend_dev_get(local_13f0);
      local_1412[0] = true;
      local_1412[1] = false;
      unique0x00005300 = local_1412;
      dev_00 = (ggml_backend_dev_t)0x2;
      local_1420 = std::initializer_list<bool>::begin((initializer_list<bool> *)(local_1412 + 2));
      pbVar4 = std::initializer_list<bool>::end((initializer_list<bool> *)in_stack_ffffffffffffeb70)
      ;
      for (; pbVar1 = stack0xffffffffffffebf0, local_1420 != pbVar4; local_1420 = local_1420 + 1) {
        pVar2 = test_roundtrip(in_stack_ffffffffffffec58,in_stack_ffffffffffffec54,
                               (bool)in_stack_ffffffffffffec53);
        local_1434 = pVar2.first;
        local_13d8 = local_1434 + local_13d8;
        iStack_1430 = pVar2.second;
        local_13dc = iStack_1430 + local_13dc;
      }
      uVar3 = (ulong)stack0xffffffffffffebf0 >> 0x20;
      seed_00 = (uint)uVar3;
      unique0x100002b0 = pbVar1;
      in_stack_ffffffffffffeb70 = test_gguf_set_kv(dev_00,seed_00);
      local_143c = in_stack_ffffffffffffeb70.first;
      local_13d8 = local_143c + local_13d8;
      iStack_1438 = in_stack_ffffffffffffeb70.second;
      local_13dc = iStack_1438 + local_13dc;
    }
    printf("%d/%d tests passed\n",(ulong)local_13d8,(ulong)local_13dc);
    if (local_13d8 == local_13dc) {
      printf("\x1b[1;32mOK\x1b[0m\n");
    }
    else {
      printf("\x1b[1;31mFAIL\x1b[0m\n");
    }
    local_4 = (uint)(local_13d8 != local_13dc);
    std::random_device::~random_device((random_device *)0x10ad44);
  }
  else {
    print_usage();
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    if (argc > 2) {
        print_usage();
        return 1;
    }

    std::random_device rd;
    const unsigned int seed = argc < 2 ? rd() : std::stoi(argv[1]);

    // Initialize ggml backends early so the prints aren't interleaved with the test results:
    ggml_backend_dev_count();
    fprintf(stderr, "\n");

    int npass = 0;
    int ntest = 0;
    {
        std::pair<int, int> result = test_handcrafted_file(seed);
        npass += result.first;
        ntest += result.second;
    }

    for (size_t i = 0; i < ggml_backend_dev_count(); ++i) {
        ggml_backend_dev_t dev = ggml_backend_dev_get(i);

        for (bool only_meta : {true, false}) {
            std::pair<int, int> result = test_roundtrip(dev, seed, only_meta);
            npass += result.first;
            ntest += result.second;
        }

        {
            std::pair<int, int> result = test_gguf_set_kv(dev, seed);
            npass += result.first;
            ntest += result.second;
        }
    }

    printf("%d/%d tests passed\n", npass, ntest);
    if (npass != ntest) {
        printf("\033[1;31mFAIL\033[0m\n");
        return 1;
    }
    printf("\033[1;32mOK\033[0m\n");
    return 0;
}